

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int str_find_aux(lua_State *L,int find)

{
  char cVar1;
  TValue *pTVar2;
  int32_t iVar3;
  int iVar4;
  GCstr *pGVar5;
  GCstr *s;
  char *e;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  GCstr *p;
  bool bVar10;
  MatchState ms;
  int local_258;
  MatchState local_250;
  
  pGVar5 = lj_lib_checkstr(L,1);
  s = lj_lib_checkstr(L,2);
  iVar3 = lj_lib_optint(L,3,1);
  uVar8 = pGVar5->len;
  uVar7 = 0xffffffff;
  if (iVar3 < 0) {
    uVar7 = uVar8;
  }
  uVar9 = 0;
  if (0 < (int)(uVar7 + iVar3)) {
    uVar9 = uVar7 + iVar3;
  }
  if (uVar8 <= uVar9) {
    uVar9 = uVar8;
  }
  if (find == 0) {
LAB_0012059e:
    cVar1 = (char)s[1].nextgc.gcptr32;
    p = (GCstr *)((long)&s[1].nextgc.gcptr32 + 1);
    if (cVar1 != '^') {
      p = s + 1;
    }
    local_250.src_end = (char *)((long)&pGVar5[1].nextgc.gcptr32 + (ulong)uVar8);
    pcVar6 = (char *)((long)&pGVar5[1].nextgc.gcptr32 + (ulong)uVar9);
    local_250.src_init = (char *)(pGVar5 + 1);
    local_250.L = L;
    do {
      uVar9 = uVar9 + 1;
      local_250.level = 0;
      local_250.depth = 0;
      e = match(&local_250,pcVar6,(char *)p);
      if (e != (char *)0x0) {
        if (find != 0) {
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pTVar2->n = (double)(int)uVar9;
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          local_258 = (int)(pGVar5 + 1);
          pTVar2->n = (double)((int)e - local_258);
          iVar4 = push_captures(&local_250,(char *)0x0,(char *)0x0);
          return iVar4 + 2;
        }
        iVar4 = push_captures(&local_250,pcVar6,e);
        return iVar4;
      }
    } while ((cVar1 != '^') && (bVar10 = pcVar6 < local_250.src_end, pcVar6 = pcVar6 + 1, bVar10));
  }
  else {
    if ((L->top <= L->base + 3) || (0xfffffffd < *(uint *)((long)L->base + 0x1c))) {
      iVar4 = lj_str_haspattern(s);
      uVar8 = pGVar5->len;
      if (iVar4 != 0) goto LAB_0012059e;
    }
    pcVar6 = lj_str_find((char *)((long)&pGVar5[1].nextgc.gcptr32 + (ulong)uVar9),(char *)(s + 1),
                         uVar8 - uVar9,s->len);
    if (pcVar6 != (char *)0x0) {
      iVar4 = (int)pcVar6 - ((int)pGVar5 + 0x10);
      L->top[-2].n = (double)(iVar4 + 1);
      L->top[-1].n = (double)(int)(iVar4 + s->len);
      return 2;
    }
  }
  *(undefined4 *)((long)L->top + -4) = 0xffffffff;
  return 1;
}

Assistant:

static int str_find_aux(lua_State *L, int find)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  GCstr *p = lj_lib_checkstr(L, 2);
  int32_t start = lj_lib_optint(L, 3, 1);
  MSize st;
  if (start < 0) start += (int32_t)s->len; else start--;
  if (start < 0) start = 0;
  st = (MSize)start;
  if (st > s->len) {
#if LJ_52
    setnilV(L->top-1);
    return 1;
#else
    st = s->len;
#endif
  }
  if (find && ((L->base+3 < L->top && tvistruecond(L->base+3)) ||
	       !lj_str_haspattern(p))) {  /* Search for fixed string. */
    const char *q = lj_str_find(strdata(s)+st, strdata(p), s->len-st, p->len);
    if (q) {
      setintV(L->top-2, (int32_t)(q-strdata(s)) + 1);
      setintV(L->top-1, (int32_t)(q-strdata(s)) + (int32_t)p->len);
      return 2;
    }
  } else {  /* Search for pattern. */
    MatchState ms;
    const char *pstr = strdata(p);
    const char *sstr = strdata(s) + st;
    int anchor = 0;
    if (*pstr == '^') { pstr++; anchor = 1; }
    ms.L = L;
    ms.src_init = strdata(s);
    ms.src_end = strdata(s) + s->len;
    do {  /* Loop through string and try to match the pattern. */
      const char *q;
      ms.level = ms.depth = 0;
      q = match(&ms, sstr, pstr);
      if (q) {
	if (find) {
	  setintV(L->top++, (int32_t)(sstr-(strdata(s)-1)));
	  setintV(L->top++, (int32_t)(q-strdata(s)));
	  return push_captures(&ms, NULL, NULL) + 2;
	} else {
	  return push_captures(&ms, sstr, q);
	}
      }
    } while (sstr++ < ms.src_end && !anchor);
  }
  setnilV(L->top-1);  /* Not found. */
  return 1;
}